

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::iterate
          (OuterEdgeVertexSetIndexIndependenceCase *this)

{
  deUint32 *this_00;
  void **ppvVar1;
  TessPrimitiveType TVar2;
  SpacingMode SVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  deUint32 tfPrimTypeGL;
  TestLog *this_01;
  undefined4 extraout_var;
  char *str;
  Functions *gl_00;
  ShaderProgram *this_02;
  const_reference pvVar7;
  const_reference pvVar8;
  RenderContext *renderCtx_00;
  size_type sVar9;
  const_reference pvVar10;
  MessageBuilder *pMVar11;
  TestLog *pTVar12;
  const_reference this_03;
  float constantOuterLevel;
  pair<std::_Rb_tree_const_iterator<tcu::Vector<float,_3>_>,_bool> pVar13;
  VertexArrayBinding *local_ce8;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  float local_c1c;
  float local_c18;
  float local_c14;
  float local_c10;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  MessageBuilder local_a38;
  MessageBuilder local_8b8;
  char *local_738;
  char *swizzleDesc;
  undefined1 local_728;
  Vector<float,_3> local_71c;
  _Base_ptr local_710;
  undefined1 local_708;
  Vector<float,_3> local_6fc;
  Vector<float,_3> *local_6f0;
  Vec3 *vtx;
  undefined1 local_6e0 [4];
  int vtxNdx;
  Vec3Set currentEdgeVertices;
  string local_6a8;
  size_type local_688;
  MessageBuilder local_680;
  MessageBuilder local_500;
  int local_37c;
  undefined1 local_378 [4];
  int refNumVertices;
  Result tfResult;
  MessageBuilder local_338;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 *local_190;
  undefined1 local_188 [8];
  VertexArrayBinding bindings [1];
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  OuterEdgeDescription *edgeDesc;
  undefined1 local_110 [4];
  int outerEdgeIndex;
  Vec3Set firstEdgeVertices;
  undefined1 local_d8 [4];
  int outerEdgeLevelCaseNdx;
  TFHandler tfHandler;
  vector<float,_std::allocator<float>_> patchTessLevels;
  int maxNumVerticesInDrawCall;
  undefined1 local_60 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  deUint32 programGL;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  OuterEdgeVertexSetIndexIndependenceCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar5),0x10,0x10,dVar6);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  this_02 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  edgeDescriptions.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::ShaderProgram::getProgram(this_02)
  ;
  outerEdgeDescriptions
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              *)local_60,this->m_primitiveType);
  (*gl_00->useProgram)
            (edgeDescriptions.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  setViewport(gl_00,(RandomViewport *)&gl);
  (*gl_00->patchParameteri)(0x8e72,6);
  constantOuterLevel = arrayMax<float,12>(&iterate::singleOuterEdgeLevels);
  generatePatchTessLevels
            ((vector<float,_std::allocator<float>_> *)
             &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object,1,0,constantOuterLevel);
  TVar2 = this->m_primitiveType;
  SVar3 = this->m_spacing;
  bVar4 = this->m_usePointMode;
  this_00 = &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)this_00,0);
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)this_00,2);
  iVar5 = referenceVertexCount(TVar2,SVar3,(bool)(bVar4 & 1),pvVar7,pvVar8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_d8,renderCtx_00,iVar5);
  for (firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 0xc;
      firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    std::
    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *)local_110);
    for (edgeDesc._4_4_ = 0;
        sVar9 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                        *)local_60), edgeDesc._4_4_ < (int)sVar9;
        edgeDesc._4_4_ = edgeDesc._4_4_ + 1) {
      pvVar10 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                              *)local_60,(long)edgeDesc._4_4_);
      generatePatchTessLevels
                ((vector<float,_std::allocator<float>_> *)&bindings[0].pointer.data,1,edgeDesc._4_4_
                 ,iterate::singleOuterEdgeLevels
                  [firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_]);
      local_1b2 = 1;
      local_190 = local_188;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"in_v_attr",&local_1b1);
      ppvVar1 = &bindings[0].pointer.data;
      sVar9 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)ppvVar1);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppvVar1,0);
      glu::va::Float((VertexArrayBinding *)local_188,&local_1b0,1,(int)sVar9,0,pvVar7);
      local_1b2 = 0;
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      tcu::TestLog::operator<<(&local_338,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_338,(char (*) [39])"Testing with outer tessellation level ");
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,iterate::singleOuterEdgeLevels +
                                   firstEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count._4_4_);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])0x2a64a2c);
      Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                ((string *)
                 &tfResult.varying.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar10);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&tfResult.varying.
                                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(char (*) [47])" edge, and with various levels for other edges");
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string
                ((string *)
                 &tfResult.varying.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::MessageBuilder::~MessageBuilder(&local_338);
      dVar6 = edgeDescriptions.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      tfPrimTypeGL = outputPrimitiveTypeGL(this->m_primitiveType,(bool)(this->m_usePointMode & 1));
      sVar9 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&bindings[0].pointer.data);
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                ((Result *)local_378,(TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_d8,
                 dVar6,tfPrimTypeGL,1,(VertexArrayBinding *)local_188,(int)sVar9);
      TVar2 = this->m_primitiveType;
      SVar3 = this->m_spacing;
      bVar4 = this->m_usePointMode;
      ppvVar1 = &bindings[0].pointer.data;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppvVar1,0);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppvVar1,2);
      local_37c = referenceVertexCount(TVar2,SVar3,(bool)(bVar4 & 1),pvVar7,pvVar8);
      sVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                        ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                         &tfResult);
      iVar5 = (int)pvVar8;
      if ((int)sVar9 == local_37c) {
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
               *)local_6e0);
        for (vtx._4_4_ = 0; iVar5 = (int)pvVar8, vtx._4_4_ < local_37c; vtx._4_4_ = vtx._4_4_ + 1) {
          local_6f0 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                      operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)&tfResult,(long)vtx._4_4_);
          bVar4 = OuterEdgeDescription::contains(pvVar10,local_6f0);
          if (bVar4) {
            if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              if (edgeDesc._4_4_ == 0) {
                tcu::Vector<float,_3>::Vector(&local_6fc,local_6f0);
              }
              else if (edgeDesc._4_4_ == 1) {
                pvVar8 = (const_reference)0x2;
                tcu::Vector<float,_3>::swizzle(&local_6fc,(int)local_6f0,1,0);
              }
              else if (edgeDesc._4_4_ == 2) {
                pvVar8 = (const_reference)0x0;
                tcu::Vector<float,_3>::swizzle(&local_6fc,(int)local_6f0,2,1);
              }
              else {
                tcu::Vector<float,_3>::Vector(&local_6fc,-1.0);
              }
              pVar13 = std::
                       set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 *)local_6e0,&local_6fc);
              local_710 = (_Base_ptr)pVar13.first._M_node;
              local_708 = pVar13.second;
            }
            else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
              if (edgeDesc._4_4_ == 0) {
                local_c10 = tcu::Vector<float,_3>::y(local_6f0);
              }
              else {
                if (edgeDesc._4_4_ == 1) {
                  local_c14 = tcu::Vector<float,_3>::x(local_6f0);
                }
                else {
                  if (edgeDesc._4_4_ == 2) {
                    local_c18 = tcu::Vector<float,_3>::y(local_6f0);
                  }
                  else {
                    if (edgeDesc._4_4_ == 3) {
                      local_c1c = tcu::Vector<float,_3>::x(local_6f0);
                    }
                    else {
                      local_c1c = -1.0;
                    }
                    local_c18 = local_c1c;
                  }
                  local_c14 = local_c18;
                }
                local_c10 = local_c14;
              }
              tcu::Vector<float,_3>::Vector(&local_71c,local_c10,0.0,0.0);
              pVar13 = std::
                       set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 *)local_6e0,&local_71c);
              swizzleDesc = (char *)pVar13.first._M_node;
              local_728 = pVar13.second;
            }
          }
        }
        if (edgeDesc._4_4_ == 0) {
          std::
          set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::operator=((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       *)local_110,
                      (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       *)local_6e0);
LAB_020966e2:
          currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        }
        else {
          bVar4 = std::operator!=((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)local_6e0,
                                  (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)local_110);
          if (!bVar4) goto LAB_020966e2;
          if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
            if (edgeDesc._4_4_ == 1) {
              local_c38 = "(y, x, z)";
            }
            else {
              local_c38 = (char *)0x0;
              if (edgeDesc._4_4_ == 2) {
                local_c38 = "(z, y, x)";
              }
            }
            local_c40 = local_c38;
          }
          else {
            if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
              if (edgeDesc._4_4_ == 1) {
                local_c48 = "(x, 0)";
              }
              else {
                if (edgeDesc._4_4_ == 2) {
                  local_c50 = "(y, 0)";
                }
                else {
                  local_c50 = (char *)0x0;
                  if (edgeDesc._4_4_ == 3) {
                    local_c50 = "(x, 0)";
                  }
                }
                local_c48 = local_c50;
              }
              local_c58 = local_c48;
            }
            else {
              local_c58 = (char *)0x0;
            }
            local_c40 = local_c58;
          }
          local_738 = local_c40;
          tcu::TestLog::operator<<(&local_a38,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_a38,(char (*) [37])"Failure: the set of vertices on the ");
          Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_a58,pvVar10);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_a58);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [6])" edge");
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(char (*) [43])" doesn\'t match the set of vertices on the ")
          ;
          this_03 = std::
                    vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                    ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                  *)local_60,0);
          Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_a78,this_03);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_a78);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [6])" edge");
          pTVar12 = tcu::MessageBuilder::operator<<
                              (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_8b8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_8b8,(char (*) [26])"Note: set of vertices on ");
          Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_a98,pvVar10);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_a98);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(char (*) [33])" edge, components swizzled like ");
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_738);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(char (*) [42])" to match component order on first edge:\n");
          containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_ab8,(Functional *)local_6e0,
                     (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x5,0,iVar5);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ab8);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [5])"\non ");
          pvVar10 = std::
                    vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                    ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                  *)local_60,0);
          Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_ad8,pvVar10);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ad8);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [8])0x2bfd66c);
          containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_af8,(Functional *)local_110,
                     (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x5,0,iVar5);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_af8);
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_ab8);
          std::__cxx11::string::~string((string *)&local_a98);
          tcu::MessageBuilder::~MessageBuilder(&local_8b8);
          std::__cxx11::string::~string((string *)&local_a78);
          std::__cxx11::string::~string((string *)&local_a58);
          tcu::MessageBuilder::~MessageBuilder(&local_a38);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          this_local._4_4_ = STOP;
          currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        }
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)local_6e0);
        if (currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
          currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        }
      }
      else {
        tcu::TestLog::operator<<(&local_680,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_680,
                             (char (*) [67])
                             "Failure: the number of vertices returned by transform feedback is ");
        local_688 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                    size((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                         &tfResult);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_688);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])0x2c24a65);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_37c);
        pTVar12 = tcu::MessageBuilder::operator<<
                            (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_500,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_500,
                             (char (*) [110])
                             "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                            );
        containerStr<std::vector<float,std::allocator<float>>>
                  (&local_6a8,(Functional *)&bindings[0].pointer.data,
                   (vector<float,_std::allocator<float>_> *)0x6,0,iVar5);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_6a8);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_6a8);
        tcu::MessageBuilder::~MessageBuilder(&local_500);
        tcu::MessageBuilder::~MessageBuilder(&local_680);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid set of vertices");
        this_local._4_4_ = STOP;
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::Result::~Result((Result *)local_378);
      if (currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      local_ce8 = (VertexArrayBinding *)&bindings[0].pointer.data;
      do {
        local_ce8 = local_ce8 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_ce8);
      } while (local_ce8 != (VertexArrayBinding *)local_188);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&bindings[0].pointer.data);
      if (currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
      goto LAB_02096828;
    }
    currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
LAB_02096828:
    std::
    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::~set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            *)local_110);
    if (currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
    goto LAB_0209686e;
  }
  currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
LAB_0209686e:
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_d8);
  if (currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
    currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
             *)local_60);
  return this_local._4_4_;
}

Assistant:

OuterEdgeVertexSetIndexIndependenceCase::IterateResult OuterEdgeVertexSetIndexIndependenceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();
	const deUint32						programGL					= m_program->getProgram();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
			{
				typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

				Vec3Set firstEdgeVertices;

				for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
				{
					const OuterEdgeDescription&		edgeDesc			= edgeDescriptions[outerEdgeIndex];
					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
						const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

						if ((int)tfResult.varying.size() != refNumVertices)
						{
							log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
													<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
								<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
													<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
							return STOP;
						}

						{
							Vec3Set currentEdgeVertices;

							// Get the vertices on the current outer edge.
							for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
							{
								const Vec3& vtx = tfResult.varying[vtxNdx];
								if (edgeDesc.contains(vtx))
								{
									// Swizzle components to match the order of the first edge.
									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										currentEdgeVertices.insert(outerEdgeIndex == 0 ? vtx
																	: outerEdgeIndex == 1 ? vtx.swizzle(1, 0, 2)
																	: outerEdgeIndex == 2 ? vtx.swizzle(2, 1, 0)
																	: Vec3(-1.0f));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										currentEdgeVertices.insert(Vec3(outerEdgeIndex == 0 ? vtx.y()
																		: outerEdgeIndex == 1 ? vtx.x()
																		: outerEdgeIndex == 2 ? vtx.y()
																		: outerEdgeIndex == 3 ? vtx.x()
																		: -1.0f,
																		0.0f, 0.0f));
									}
									else
										DE_ASSERT(false);
								}
							}

							if (outerEdgeIndex == 0)
								firstEdgeVertices = currentEdgeVertices;
							else
							{
								// Compare vertices of this edge to those of the first edge.

								if (currentEdgeVertices != firstEdgeVertices)
								{
									const char* const swizzleDesc = m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)"
																													: outerEdgeIndex == 2 ? "(z, y, x)"
																													: DE_NULL)
																	: m_primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)"
																												: outerEdgeIndex == 2 ? "(y, 0)"
																												: outerEdgeIndex == 3 ? "(x, 0)"
																												: DE_NULL)
																	: DE_NULL;

									log << TestLog::Message << "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
															<< " doesn't match the set of vertices on the " << edgeDescriptions[0].description() << " edge" << TestLog::EndMessage
										<< TestLog::Message << "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
															<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
															<< "\non " << edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}